

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O1

void xmlSAX2InternalSubset(void *ctx,xmlChar *name,xmlChar *ExternalID,xmlChar *SystemID)

{
  xmlDtdPtr pxVar1;
  
  if (((ctx != (void *)0x0) && (*(xmlDoc **)((long)ctx + 0x10) != (xmlDoc *)0x0)) &&
     ((*(int *)((long)ctx + 0x34) == 0 || (*(int *)((long)ctx + 0x110) == 1)))) {
    pxVar1 = xmlGetIntSubset(*(xmlDoc **)((long)ctx + 0x10));
    if (pxVar1 != (xmlDtdPtr)0x0) {
      xmlUnlinkNode((xmlNodePtr)pxVar1);
      xmlFreeDtd(pxVar1);
      *(undefined8 *)(*(long *)((long)ctx + 0x10) + 0x50) = 0;
    }
    pxVar1 = xmlCreateIntSubset(*(xmlDocPtr *)((long)ctx + 0x10),name,ExternalID,SystemID);
    *(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x50) = pxVar1;
    if (pxVar1 == (xmlDtdPtr)0x0) {
      xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
      return;
    }
  }
  return;
}

Assistant:

void
xmlSAX2InternalSubset(void *ctx, const xmlChar *name,
	       const xmlChar *ExternalID, const xmlChar *SystemID)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlDtdPtr dtd;
    if (ctx == NULL) return;

    if (ctxt->myDoc == NULL)
	return;
    if ((ctxt->html) && (ctxt->instate != XML_PARSER_MISC))
        return;
    dtd = xmlGetIntSubset(ctxt->myDoc);
    if (dtd != NULL) {
	xmlUnlinkNode((xmlNodePtr) dtd);
	xmlFreeDtd(dtd);
	ctxt->myDoc->intSubset = NULL;
    }
    ctxt->myDoc->intSubset =
	xmlCreateIntSubset(ctxt->myDoc, name, ExternalID, SystemID);
    if (ctxt->myDoc->intSubset == NULL)
        xmlSAX2ErrMemory(ctxt);
}